

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O2

void b_array::ordered_insert<Map::Pair<std::__cxx11::string,sql_parser::Keyword>>
               (Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
                *data,size_t *size,
               Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
               *entry)

{
  bool bVar1;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>
  *__rhs;
  ulong index;
  ulong uVar2;
  
  uVar2 = 0;
  index = 0;
  while (index < *size) {
    __rhs = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
            ::operator[](data,index);
    bVar1 = std::operator>(&entry->key,&__rhs->key);
    index = index + 1;
    if (bVar1) {
      uVar2 = index & 0xffffffff;
    }
  }
  insert_item<Map::Pair<std::__cxx11::string,sql_parser::Keyword>>(data,(long)(int)uVar2,size,entry)
  ;
  return;
}

Assistant:

void ordered_insert(b_array::Array<T>& data, size_t& size, const T& entry) {
    int pos = 0;
    for (size_t i = 0; i < size; i++) {
        if (entry > data[i]) {
            pos = i + 1;
        }
    }
    insert_item(data, pos, size, entry);
}